

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O0

LLVMValueRef CompileLlvmWhile(LlvmCompilationContext *ctx,ExprWhile *node)

{
  ExprBase *pEVar1;
  ExprWhile *pEVar2;
  int iVar3;
  LLVMValueRef pLVar4;
  TypeBase *type;
  LLVMTypeRef pLVar5;
  LLVMValueRef pLVar6;
  LLVMValueRef condition;
  LLVMBasicBlockRef local_30;
  LLVMBasicBlockRef exitBlock;
  LLVMBasicBlockRef bodyBlock;
  LLVMBasicBlockRef conditionBlock;
  ExprWhile *node_local;
  LlvmCompilationContext *ctx_local;
  
  conditionBlock = (LLVMBasicBlockRef)node;
  node_local = (ExprWhile *)ctx;
  bodyBlock = LLVMAppendBasicBlockInContext(ctx->context,ctx->currentFunction,"while_cond");
  exitBlock = LLVMAppendBasicBlockInContext
                        ((LLVMContextRef)(node_local->super_ExprBase).source,
                         (LLVMValueRef)node_local[0x42].super_ExprBase._vptr_ExprBase,"while_body");
  local_30 = LLVMAppendBasicBlockInContext
                       ((LLVMContextRef)(node_local->super_ExprBase).source,
                        (LLVMValueRef)node_local[0x42].super_ExprBase._vptr_ExprBase,"while_exit");
  pEVar2 = node_local + 0x44;
  LlvmCompilationContext::LoopInfo::LoopInfo((LoopInfo *)&condition,local_30,bodyBlock);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::push_back
            ((SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)&pEVar2->condition,
             (LoopInfo *)&condition);
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  pLVar4 = CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(conditionBlock + 0x30));
  pEVar2 = node_local;
  iVar3 = LLVMIntNE;
  pEVar1 = (node_local->super_ExprBase).next;
  type = GetStackType((LlvmCompilationContext *)node_local,
                      *(TypeBase **)(*(long *)(conditionBlock + 0x30) + 0x18));
  pLVar5 = CompileLlvmType((LlvmCompilationContext *)pEVar2,type);
  pLVar6 = LLVMConstInt(pLVar5,0,true);
  pLVar4 = LLVMBuildICmp((LLVMBuilderRef)pEVar1,iVar3,pLVar4,pLVar6,"");
  LLVMBuildCondBr((LLVMBuilderRef)(node_local->super_ExprBase).next,pLVar4,exitBlock,local_30);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,exitBlock);
  CompileLlvm((LlvmCompilationContext *)node_local,*(ExprBase **)(conditionBlock + 0x38));
  LLVMBuildBr((LLVMBuilderRef)(node_local->super_ExprBase).next,bodyBlock);
  LLVMPositionBuilderAtEnd((LLVMBuilderRef)(node_local->super_ExprBase).next,local_30);
  SmallArray<LlvmCompilationContext::LoopInfo,_32U>::pop_back
            ((SmallArray<LlvmCompilationContext::LoopInfo,_32U> *)&node_local[0x44].condition);
  pLVar4 = CheckType((LlvmCompilationContext *)node_local,(ExprBase *)conditionBlock,
                     (LLVMValueRef)0x0);
  return pLVar4;
}

Assistant:

LLVMValueRef CompileLlvmWhile(LlvmCompilationContext &ctx, ExprWhile *node)
{
	LLVMBasicBlockRef conditionBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_cond");
	LLVMBasicBlockRef bodyBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_body");
	LLVMBasicBlockRef exitBlock = LLVMAppendBasicBlockInContext(ctx.context, ctx.currentFunction, "while_exit");

	ctx.loopInfo.push_back(LlvmCompilationContext::LoopInfo(exitBlock, conditionBlock));

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, conditionBlock);

	LLVMValueRef condition = CompileLlvm(ctx, node->condition);

	condition = LLVMBuildICmp(ctx.builder, LLVMIntNE, condition, LLVMConstInt(CompileLlvmType(ctx, GetStackType(ctx, node->condition->type)), 0, true), "");

	LLVMBuildCondBr(ctx.builder, condition, bodyBlock, exitBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, bodyBlock);

	CompileLlvm(ctx, node->body);

	LLVMBuildBr(ctx.builder, conditionBlock);

	LLVMPositionBuilderAtEnd(ctx.builder, exitBlock);

	ctx.loopInfo.pop_back();

	return CheckType(ctx, node, NULL);
}